

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_misc.c
# Opt level: O0

err_t bignDH(octet *key,bign_params *params,octet *privkey,octet *pubkey,size_t key_len)

{
  size_t n_00;
  bool_t bVar1;
  int iVar2;
  word *a;
  ec_o *ec_00;
  bign_deep_i in_RCX;
  word *in_RDX;
  ec_o *in_RSI;
  word *in_RDI;
  void *in_R8;
  void *stack;
  word *Q;
  word *d;
  ec_o *ec;
  void *state;
  size_t n;
  size_t no;
  err_t code;
  void *in_stack_ffffffffffffff88;
  bign_params *in_stack_ffffffffffffff90;
  size_t *dest;
  size_t *stack_00;
  bign_params *in_stack_ffffffffffffffc0;
  void *count;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar3;
  
  bVar1 = memIsValid(in_RSI,0x150);
  if (bVar1 == 0) {
    eVar3 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(in_stack_ffffffffffffff90);
    if (bVar1 == 0) {
      eVar3 = 0x1f6;
    }
    else {
      bignStart_keep((size_t)in_RDX,in_RCX);
      a = (word *)blobCreate((size_t)in_stack_ffffffffffffff88);
      if (a == (word *)0x0) {
        eVar3 = 0x6e;
      }
      else {
        eVar3 = bignStart((void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc0);
        if (eVar3 == 0) {
          count = *(void **)(a[3] + 0x38);
          n_00 = *(size_t *)(a[3] + 0x30);
          if ((void *)((long)count * 2) < in_R8) {
            blobClose((blob_t)0x1455eb);
            eVar3 = 0x1fb;
          }
          else {
            bVar1 = memIsValid(in_RDX,(size_t)count);
            if (((bVar1 != 0) && (bVar1 = memIsValid(in_RCX,(long)count << 1), bVar1 != 0)) &&
               (bVar1 = memIsValid(in_RDI,(size_t)in_R8), bVar1 != 0)) {
              ec_00 = (ec_o *)((long)a + *a);
              stack_00 = &(ec_00->hdr).keep + n_00;
              dest = stack_00 + n_00 * 2;
              u64From(dest,in_stack_ffffffffffffff88,0x1456a3);
              bVar1 = wwIsZero((word *)ec_00,n_00);
              if ((bVar1 != 0) || (iVar2 = wwCmp((word *)ec_00,(word *)a[7],n_00), -1 < iVar2)) {
                blobClose((blob_t)0x1456de);
                return 0x1f8;
              }
              iVar2 = (**(code **)(a[3] + 0x40))(stack_00,in_RCX,a[3],dest);
              if ((iVar2 != 0) &&
                 ((iVar2 = (**(code **)(a[3] + 0x40))
                                     (stack_00 + n_00,in_RCX + (long)count,a[3],dest), iVar2 != 0 &&
                  (bVar1 = ecpIsOnA(a,ec_00,stack_00), bVar1 != 0)))) {
                bVar1 = ecMulA((word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                               ,in_RDI,in_RSI,in_RDX,(size_t)in_RCX,in_R8);
                if (bVar1 == 0) {
                  eVar3 = 0x1f6;
                }
                else {
                  (**(code **)(a[3] + 0x48))(stack_00,stack_00,a[3],dest);
                  if (count < in_R8) {
                    (**(code **)(a[3] + 0x48))
                              ((long)stack_00 + (long)count,stack_00 + n_00,a[3],dest);
                  }
                  memCopy(dest,in_stack_ffffffffffffff88,0x14582f);
                }
                blobClose((blob_t)0x145843);
                return eVar3;
              }
              blobClose((blob_t)0x145777);
              return 0x1f9;
            }
            blobClose((blob_t)0x145641);
            eVar3 = 0x6d;
          }
        }
        else {
          blobClose((blob_t)0x145594);
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t bignDH(octet key[], const bign_params* params, const octet privkey[],
	const octet pubkey[], size_t key_len)
{
	err_t code;
	size_t no, n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* Q;				/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignDH_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	// проверить длину key
	if (key_len > 2 * no)
	{
		blobClose(state);
		return ERR_BAD_SHAREDKEY;
	}
	// проверить входные указатели
	if (!memIsValid(privkey, no) || 
		!memIsValid(pubkey, 2 * no) ||
		!memIsValid(key, key_len))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + n;
	stack = Q + 2 * n;
	// загрузить d
	wwFrom(d, privkey, no);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// загрузить Q
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, n), pubkey + no, ec->f, stack) ||
		!ecpIsOnA(Q, ec, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// Q <- d Q
	if (ecMulA(Q, Q, ec, d, n, stack))
	{
		// выгрузить общий ключ
		qrTo((octet*)Q, ecX(Q), ec->f, stack);
		if (key_len > no)
			qrTo((octet*)Q + no, ecY(Q, n), ec->f, stack);
		memCopy(key, Q, key_len);
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}